

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

reference __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
::iterator::operator*(iterator *this)

{
  iterator *piVar1;
  bool bVar2;
  reference in_RAX;
  code *pcVar3;
  reference ppFVar4;
  iterator *in_RCX;
  iterator *piVar5;
  iterator *extraout_RDX;
  iterator *in_RSI;
  
  if (this == (iterator *)0x0) {
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::FileDescriptor_const*>,google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,std::allocator<google::protobuf::FileDescriptor_const*>>
    ::iterator::operator*((iterator *)0x0);
LAB_001fdf24:
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::FileDescriptor_const*>,google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,std::allocator<google::protobuf::FileDescriptor_const*>>
    ::iterator::operator*((iterator *)this);
  }
  else {
    if (this == (iterator *)absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>
       ) goto LAB_001fdf24;
    if (-1 < *(char *)&this->ctrl_) {
      return in_RAX;
    }
  }
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::FileDescriptor_const*>,google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,std::allocator<google::protobuf::FileDescriptor_const*>>
  ::iterator::operator*((iterator *)this);
  if ((this == (iterator *)absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>
       || this == (iterator *)0x0) || (-1 < (char)*(code *)&this->ctrl_)) {
    pcVar3 = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>;
    if ((extraout_RDX ==
         (iterator *)absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double> ||
         extraout_RDX == (iterator *)0x0) || (-1 < (char)*(code *)&extraout_RDX->ctrl_)) {
      if (this == (iterator *)
                  absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double> &&
          extraout_RDX ==
          (iterator *)absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>) {
LAB_001fdff2:
        return (reference)CONCAT71((int7)((ulong)pcVar3 >> 8),this == extraout_RDX);
      }
      if ((this == (iterator *)
                   absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>) !=
          (extraout_RDX ==
          (iterator *)absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>))
      goto LAB_001fe00e;
      pcVar3 = (code *)CONCAT71(0x4ca7,extraout_RDX == (iterator *)0x0);
      if (this == (iterator *)0x0 || extraout_RDX == (iterator *)0x0) goto LAB_001fdff2;
      bVar2 = (extraout_RDX == (iterator *)&kSooControl) != (this == (iterator *)&kSooControl);
      pcVar3 = (code *)CONCAT71(0x4ca0,bVar2);
      if (!bVar2) {
        if (this == (iterator *)&kSooControl) {
          if (in_RSI == in_RCX) goto LAB_001fdff2;
        }
        else {
          piVar5 = in_RCX;
          piVar1 = extraout_RDX;
          pcVar3 = (code *)in_RSI;
          if (extraout_RDX < this) {
            piVar5 = in_RSI;
            piVar1 = this;
            pcVar3 = (code *)in_RCX;
          }
          if ((piVar1 < pcVar3) && (pcVar3 <= piVar5)) goto LAB_001fdff2;
        }
      }
      container_internal::operator==();
      goto LAB_001fe004;
    }
  }
  else {
LAB_001fe004:
    container_internal::operator==();
  }
  container_internal::operator==();
LAB_001fe00e:
  container_internal::operator==();
  if (this == (iterator *)0x1) {
    __assert_fail("!is_soo()",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xf6a,
                  "void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::FieldDescriptor *>, google::protobuf::(anonymous namespace)::ParentNumberHash, google::protobuf::(anonymous namespace)::ParentNumberEq, std::allocator<const google::protobuf::FieldDescriptor *>>::prefetch_heap_block() const [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::FieldDescriptor *>, Hash = google::protobuf::(anonymous namespace)::ParentNumberHash, Eq = google::protobuf::(anonymous namespace)::ParentNumberEq, Alloc = std::allocator<const google::protobuf::FieldDescriptor *>]"
                 );
  }
  if (this == (iterator *)0x0) {
    __assert_fail("!kEnabled || cap >= kCapacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xb37,
                  "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::FieldDescriptor *>, google::protobuf::(anonymous namespace)::ParentNumberHash, google::protobuf::(anonymous namespace)::ParentNumberEq, std::allocator<const google::protobuf::FieldDescriptor *>>::capacity() const [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::FieldDescriptor *>, Hash = google::protobuf::(anonymous namespace)::ParentNumberHash, Eq = google::protobuf::(anonymous namespace)::ParentNumberEq, Alloc = std::allocator<const google::protobuf::FieldDescriptor *>]"
                 );
  }
  ppFVar4 = (reference)
            raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ::control((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       *)this);
  return ppFVar4;
}

Assistant:

reference operator*() const {
      AssertIsFull(ctrl_, generation(), generation_ptr(), "operator*()");
      return unchecked_deref();
    }